

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

bool __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::operator==(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *this,sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *ht)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference piVar5;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RSI;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  const_iterator it2;
  const_iterator it;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffea0;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff40;
  bool local_1;
  
  sVar3 = size(in_stack_fffffffffffffea0);
  sVar4 = size(in_stack_fffffffffffffea0);
  if (sVar3 == sVar4) {
    if (in_RDI == in_RSI) {
      local_1 = true;
    }
    else {
      begin(in_stack_ffffffffffffff30);
      while( true ) {
        end(in_stack_ffffffffffffff30);
        bVar1 = sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::operator!=((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                              *)in_stack_fffffffffffffea0,
                             (const_iterator *)
                             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        if (!bVar1) break;
        in_stack_fffffffffffffea0 = in_RSI;
        sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        ::operator*((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)0xb4bddd);
        get_key(in_stack_fffffffffffffea0,
                (const_reference)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        find<int>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        end(in_stack_ffffffffffffff30);
        bVar2 = sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::operator==((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                              *)in_stack_fffffffffffffea0,
                             (const_iterator *)
                             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        bVar1 = true;
        if (!bVar2) {
          piVar5 = sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   ::operator*((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                *)0xb4be3d);
          in_stack_fffffffffffffe9c = *piVar5;
          piVar5 = sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   ::operator*((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                *)0xb4be4d);
          bVar1 = in_stack_fffffffffffffe9c != *piVar5;
        }
        if (bVar1) {
          return false;
        }
        sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        ::operator++((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)in_stack_fffffffffffffea0);
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator==(const sparse_hashtable& ht) const {
    if (size() != ht.size()) {
      return false;
    } else if (this == &ht) {
      return true;
    } else {
      // Iterate through the elements in "this" and see if the
      // corresponding element is in ht
      for (const_iterator it = begin(); it != end(); ++it) {
        const_iterator it2 = ht.find(get_key(*it));
        if ((it2 == ht.end()) || (*it != *it2)) {
          return false;
        }
      }
      return true;
    }
  }